

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-whisper.cpp
# Opt level: O2

bool read_audio_data(string *fname,vector<float,_std::allocator<float>_> *pcmf32,
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *pcmf32s,bool stereo)

{
  pointer pfVar1;
  pointer pvVar2;
  bool bVar3;
  ma_result mVar4;
  size_t sVar5;
  char *pcVar6;
  undefined7 in_register_00000009;
  ma_uint64 mVar7;
  FILE *__stream;
  char *__format;
  vector<unsigned_char,_std::allocator<unsigned_char>_> audio_data;
  ma_uint64 frames_read;
  ma_decoder_config local_6e8;
  ma_uint64 frame_count;
  undefined8 uStack_650;
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined8 local_624;
  ma_decoder decoder;
  
  audio_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  audio_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  audio_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8.channels = (int)CONCAT71(in_register_00000009,stereo) + 1;
  local_648 = 0;
  frame_count = 0;
  uStack_650 = 0;
  local_6e8.allocationCallbacks.pUserData = (void *)0x0;
  local_6e8.allocationCallbacks.onMalloc = (_func_void_ptr_size_t_void_ptr *)0x0;
  local_6e8.allocationCallbacks.onRealloc = (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0;
  local_6e8.allocationCallbacks.onFree = (_func_void_void_ptr_void_ptr *)0x0;
  local_6e8._116_8_ = 0;
  local_6e8.ppCustomBackendVTables._4_4_ = 0;
  local_6e8.customBackendCount = 0;
  local_6e8._132_4_ = 0;
  local_6e8.pCustomBackendUserData = (void *)0x0;
  local_624 = 0;
  uStack_644 = 0;
  uStack_640 = 0;
  uStack_63c = 0;
  uStack_638 = 0;
  uStack_634 = 0;
  uStack_630 = 0;
  uStack_62c = 0;
  uStack_628 = 0;
  local_6e8.format = ma_format_f32;
  local_6e8.sampleRate = 16000;
  local_6e8._12_8_ = 0;
  local_6e8._20_8_ = 0;
  local_6e8.ditherMode = ma_dither_mode_none;
  local_6e8.resampling.format = ma_format_unknown;
  local_6e8.resampling.channels = 0;
  local_6e8.resampling.sampleRateIn = 0;
  local_6e8.resampling.sampleRateOut = 0;
  local_6e8.resampling.algorithm = ma_resample_algorithm_linear;
  local_6e8.resampling._20_4_ = 0;
  local_6e8.resampling.pBackendVTable._0_4_ = 0;
  local_6e8.resampling.pBackendVTable._4_4_ = 0;
  local_6e8.resampling.pBackendUserData = (void *)0x0;
  local_6e8.resampling.linear.lpfOrder = 4;
  local_6e8.resampling._44_4_ = 0;
  local_6e8.encodingFormat = ma_encoding_format_unknown;
  bVar3 = std::operator==(fname,"-");
  if (bVar3) {
    while( true ) {
      sVar5 = fread(&frame_count,1,0x400,_stdin);
      if (sVar5 == 0) break;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&audio_data,
                 (const_iterator)
                 audio_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(uchar *)&frame_count,
                 (uchar *)((long)&frame_count + sVar5));
    }
    mVar4 = ma_decoder_init_memory
                      (audio_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)audio_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)audio_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,&local_6e8,&decoder);
    __stream = _stderr;
    if (mVar4 == MA_SUCCESS) {
      fprintf(_stderr,"%s: read %zu bytes from stdin\n","read_audio_data",
              (long)audio_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)audio_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
      goto LAB_00174129;
    }
    pcVar6 = ma_result_description(mVar4);
    __format = "Error: failed to open audio data from stdin (%s)\n";
  }
  else {
    mVar4 = ma_decoder_init_file((fname->_M_dataplus)._M_p,&local_6e8,&decoder);
    if (mVar4 != MA_SUCCESS) {
      mVar4 = ma_decoder_init_memory
                        ((fname->_M_dataplus)._M_p,fname->_M_string_length,&local_6e8,&decoder);
      __stream = _stderr;
      if (mVar4 != MA_SUCCESS) {
        pcVar6 = ma_result_description(mVar4);
        __format = "error: failed to read audio data as wav (%s)\n";
        goto LAB_0017431a;
      }
    }
LAB_00174129:
    mVar4 = ma_decoder_get_length_in_pcm_frames(&decoder,&frame_count);
    if (mVar4 == MA_SUCCESS) {
      std::vector<float,_std::allocator<float>_>::resize(pcmf32,frame_count << (stereo & 0x3fU));
      mVar4 = ma_decoder_read_pcm_frames
                        (&decoder,(pcmf32->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data._M_start,frame_count,&frames_read)
      ;
      if (mVar4 == MA_SUCCESS) {
        if (stereo) {
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::resize(pcmf32s,2);
          std::vector<float,_std::allocator<float>_>::resize
                    ((pcmf32s->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,frame_count);
          std::vector<float,_std::allocator<float>_>::resize
                    ((pcmf32s->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1,frame_count);
          pfVar1 = (pcmf32->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar2 = (pcmf32s->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          for (mVar7 = 0; frame_count != mVar7; mVar7 = mVar7 + 1) {
            *(float *)(*(long *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                 .super__Vector_impl_data + mVar7 * 4) = pfVar1[mVar7 * 2];
            *(float *)(*(long *)&pvVar2[1].super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data + mVar7 * 4) = pfVar1[mVar7 * 2 + 1];
          }
        }
        bVar3 = true;
        ma_decoder_uninit(&decoder);
        goto LAB_001741fa;
      }
      __format = "error: failed to read the frames of the audio data (%s)\n";
    }
    else {
      __format = "error: failed to retrieve the length of the audio data (%s)\n";
    }
    __stream = _stderr;
    pcVar6 = ma_result_description(mVar4);
  }
LAB_0017431a:
  bVar3 = false;
  fprintf(__stream,__format,pcVar6);
LAB_001741fa:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&audio_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar3;
}

Assistant:

bool read_audio_data(const std::string & fname, std::vector<float>& pcmf32, std::vector<std::vector<float>>& pcmf32s, bool stereo) {
    std::vector<uint8_t> audio_data; // used for pipe input from stdin or ffmpeg decoding output

    ma_result result;
    ma_decoder_config decoder_config;
    ma_decoder decoder;

    decoder_config = ma_decoder_config_init(ma_format_f32, stereo ? 2 : 1, WHISPER_SAMPLE_RATE);

    if (fname == "-") {
		#ifdef _WIN32
		_setmode(_fileno(stdin), _O_BINARY);
		#endif

		uint8_t buf[1024];
		while (true)
		{
			const size_t n = fread(buf, 1, sizeof(buf), stdin);
			if (n == 0) {
				break;
			}
			audio_data.insert(audio_data.end(), buf, buf + n);
		}

		if ((result = ma_decoder_init_memory(audio_data.data(), audio_data.size(), &decoder_config, &decoder)) != MA_SUCCESS) {

			fprintf(stderr, "Error: failed to open audio data from stdin (%s)\n", ma_result_description(result));

			return false;
		}

		fprintf(stderr, "%s: read %zu bytes from stdin\n", __func__, audio_data.size());
    }
    else if (((result = ma_decoder_init_file(fname.c_str(), &decoder_config, &decoder)) != MA_SUCCESS)) {
#if defined(WHISPER_FFMPEG)
		if (ffmpeg_decode_audio(fname, audio_data) != 0) {
			fprintf(stderr, "error: failed to ffmpeg decode '%s'\n", fname.c_str());

			return false;
		}

		if ((result = ma_decoder_init_memory(audio_data.data(), audio_data.size(), &decoder_config, &decoder)) != MA_SUCCESS) {
			fprintf(stderr, "error: failed to read audio data as wav (%s)\n", ma_result_description(result));

			return false;
		}
#else
		if ((result = ma_decoder_init_memory(fname.c_str(), fname.size(), &decoder_config, &decoder)) != MA_SUCCESS) {
			fprintf(stderr, "error: failed to read audio data as wav (%s)\n", ma_result_description(result));

			return false;
		}
#endif
    }

    ma_uint64 frame_count;
    ma_uint64 frames_read;

    if ((result = ma_decoder_get_length_in_pcm_frames(&decoder, &frame_count)) != MA_SUCCESS) {
		fprintf(stderr, "error: failed to retrieve the length of the audio data (%s)\n", ma_result_description(result));

		return false;
    }

    pcmf32.resize(stereo ? frame_count*2 : frame_count);

    if ((result = ma_decoder_read_pcm_frames(&decoder, pcmf32.data(), frame_count, &frames_read)) != MA_SUCCESS) {
		fprintf(stderr, "error: failed to read the frames of the audio data (%s)\n", ma_result_description(result));

		return false;
    }

    if (stereo) {
		pcmf32s.resize(2);
		pcmf32s[0].resize(frame_count);
		pcmf32s[1].resize(frame_count);
		for (uint64_t i = 0; i < frame_count; i++) {
			pcmf32s[0][i] = pcmf32[2*i];
			pcmf32s[1][i] = pcmf32[2*i + 1];
		}
    }

    ma_decoder_uninit(&decoder);

    return true;
}